

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O2

void foo6(int *a)

{
  ostream *poVar1;
  int iVar2;
  state_saver<int_&,_nstd::detail::on_success_policy> local_40;
  
  for (iVar2 = -1; iVar2 != 0; iVar2 = iVar2 + 1) {
    *a = 1;
    poVar1 = std::operator<<((ostream *)&std::cout,"foo6 a = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
    std::endl<char,std::char_traits<char>>(poVar1);
    local_40.policy_.ec_ = std::uncaught_exceptions();
    local_40.previous_value_ = *a;
    local_40.previous_ref_ = a;
    nstd::detail::state_saver<int_&,_nstd::detail::on_success_policy>::~state_saver(&local_40);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"foo6 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void foo6(int& a) {
  WITH_SAVER_SUCCESS(a) {
    a = 1;
    std::cout << "foo6 a = " << a << std::endl;
    // Original state will automatically restored, on scope leave when no exceptions have been thrown.
  }

  std::cout << "foo6 a = " << a << std::endl;
}